

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintExpressionContents::visitTableGrow(PrintExpressionContents *this,TableGrow *curr)

{
  ostream *in_RCX;
  Name name;
  
  printMedium(this->o,"table.grow ");
  name.super_IString.str._M_str = (char *)this->o;
  name.super_IString.str._M_len = (size_t)(curr->table).super_IString.str._M_str;
  anon_unknown_217::printName
            ((anon_unknown_217 *)(curr->table).super_IString.str._M_len,name,in_RCX);
  return;
}

Assistant:

void visitTableGrow(TableGrow* curr) {
    printMedium(o, "table.grow ");
    printName(curr->table, o);
  }